

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spear.cpp
# Opt level: O0

void __thiscall Spear::Spear(Spear *this,string *n,int t,int spT)

{
  int spT_00;
  int t_00;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  int local_20;
  int local_1c;
  int spT_local;
  int t_local;
  string *n_local;
  Spear *this_local;
  
  local_20 = spT;
  local_1c = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)n);
  t_00 = local_1c;
  spT_00 = local_20;
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Item. Spear: ");
  Item::Item(&this->super_Item,(string *)local_40,t_00,spT_00,0,0,2,1,1,2,3,local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_40);
  (this->super_Item).super_GreenCard.super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b4c0
  ;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->cardText);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->cost = 0;
  this->tapped = false;
  this->attackBonus = 0;
  this->defenseBonus = 2;
  this->minimumHonor = 1;
  std::operator+((char *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Item. Spear: ");
  std::__cxx11::string::operator=((string *)&this->cardText,local_90);
  std::__cxx11::string::~string(local_90);
  this->effectBonus = 1;
  this->effectCost = 2;
  this->durability = 3;
  return;
}

Assistant:

Spear::Spear(string n, int t, int spT) : Item{n, t, spT, 0, 0, 2, 1, 1, 2, 3, "Green Card - Item. Spear: " + n}
{
    name = n;
    cost = 0;
    tapped = false;

    attackBonus = 0;
    defenseBonus = 2;
    minimumHonor = 1;
    cardText = "Green Card - Item. Spear: " + name;

    effectBonus = 1;
    effectCost = 2;
    durability = 3;
}